

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O0

size_t __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::discard_counter
          (mpmc_blocking_queue<spdlog::details::async_msg> *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(relaxed,__memory_order_mask);
  return *(size_t *)(in_RDI + 0xc0);
}

Assistant:

size_t discard_counter() { return discard_counter_.load(std::memory_order_relaxed); }